

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall
CRegexParser::get_match_length
          (CRegexParser *this,re_state_id init,re_state_id final,int *minlen,int *maxlen,
          regex_scan_frame *stack)

{
  re_tuple_conflict *prVar1;
  wchar_t wVar2;
  regex_scan_frame *prVar3;
  uint uVar4;
  anon_union_16_5_eb0a944d_for_info *paVar5;
  int final_00;
  uint uVar6;
  int init_00;
  int iVar7;
  long lVar8;
  int gmin;
  int gmax;
  int max1;
  int max2;
  uint local_68;
  uint local_64;
  regex_scan_frame local_60;
  uint local_4c;
  uint *local_48;
  uint *local_40;
  uint local_34;
  
  local_60.parent = stack;
  *maxlen = 0;
  *minlen = 0;
  if (init == final) {
    return;
  }
  local_48 = (uint *)maxlen;
  do {
    prVar1 = this->tuple_arr_ + init;
    prVar1->flags = prVar1->flags | 8;
    lVar8 = 0x18;
    local_60.st = init;
    switch(prVar1->typ) {
    case RE_EPSILON:
      if (prVar1->next_state_2 != -1) {
        prVar3 = &local_60;
        do {
          prVar3 = prVar3->parent;
          if (prVar3 == (regex_scan_frame *)0x0) {
            get_match_length(this,prVar1->next_state_1,final,(int *)&local_68,(int *)&local_4c,
                             &local_60);
            get_match_length(this,prVar1->next_state_2,final,(int *)&local_64,(int *)&local_34,
                             &local_60);
            uVar6 = local_64;
            if (local_68 < local_64) {
              uVar6 = local_68;
            }
            if ((int)local_64 < 0) {
              uVar6 = local_68;
            }
            if ((int)local_68 < 0) {
              uVar6 = local_64;
            }
            uVar4 = uVar6 + *minlen;
            if ((int)(uVar6 | *minlen) < 0) {
              uVar4 = 0xffffffff;
            }
            *minlen = uVar4;
            uVar6 = local_34;
            if ((int)local_34 < (int)local_4c) {
              uVar6 = local_4c;
            }
            if ((int)(local_34 | local_4c) < 0) {
              uVar6 = 0xffffffff;
            }
            uVar4 = uVar6 + *maxlen;
            if ((int)(uVar6 | *maxlen) < 0) {
              uVar4 = 0xffffffff;
            }
            *maxlen = uVar4;
            return;
          }
        } while (prVar3->st != init);
        *maxlen = 0xffffffff;
        return;
      }
      break;
    default:
      uVar6 = *minlen + 1;
      if (*minlen < 0) {
        uVar6 = 0xffffffff;
      }
      *minlen = uVar6;
      uVar6 = *maxlen + 1;
      if (*maxlen < 0) {
        uVar6 = 0xffffffff;
      }
      *maxlen = uVar6;
      break;
    case RE_TEXT_BEGIN:
    case RE_TEXT_END:
    case RE_LOOKBACK_POS:
    case RE_WORD_BEGIN:
    case RE_WORD_END:
    case RE_WORD_BOUNDARY:
    case RE_NON_WORD_BOUNDARY:
    case RE_GROUP_ENTER:
    case RE_GROUP_EXIT:
    case RE_ASSERT_POS:
    case RE_ASSERT_NEG:
    case RE_ASSERT_BACKPOS:
    case RE_ASSERT_BACKNEG:
    case RE_ZERO_VAR:
      break;
    case RE_GROUP_MATCH:
      prVar3 = &local_60;
      do {
        prVar3 = prVar3->parent;
        if (prVar3 == (regex_scan_frame *)0x0) {
          if (0 < this->next_state_) {
            paVar5 = &this->tuple_arr_->info;
            iVar7 = 0;
            final_00 = -1;
            init_00 = -1;
            do {
              wVar2 = ((re_tuple_conflict *)((long)paVar5 + -8))->typ;
              if (wVar2 == L'\x12') {
                if (paVar5->ch == (prVar1->info).ch) {
                  final_00 = iVar7;
                }
              }
              else if ((wVar2 == L'\x11') && (paVar5->ch == (prVar1->info).ch)) {
                init_00 = iVar7;
              }
              iVar7 = iVar7 + 1;
              paVar5 = (anon_union_16_5_eb0a944d_for_info *)((long)paVar5 + 0x28);
            } while (this->next_state_ != iVar7);
            if ((-1 < init_00) && (-1 < final_00)) {
              local_40 = (uint *)minlen;
              get_match_length(this,init_00,final_00,(int *)&local_68,(int *)&local_64,&local_60);
              uVar6 = *local_40 + local_68;
              if ((int)(*local_40 | local_68) < 0) {
                uVar6 = 0xffffffff;
              }
              *local_40 = uVar6;
              uVar6 = *local_48 + local_64;
              if ((int)(*local_48 | local_64) < 0) {
                uVar6 = 0xffffffff;
              }
              *local_48 = uVar6;
              maxlen = (int *)local_48;
              minlen = (int *)local_40;
            }
          }
          goto switchD_002ad0ac_caseD_6;
        }
      } while (prVar3->st != init);
      *maxlen = 0xffffffff;
      break;
    case RE_LOOP_BRANCH:
      prVar3 = &local_60;
      do {
        prVar3 = prVar3->parent;
        if (prVar3 == (regex_scan_frame *)0x0) {
          get_match_length(this,prVar1->next_state_1,init,(int *)&local_68,(int *)&local_64,
                           &local_60);
          uVar6 = (prVar1->info).ch * local_68;
          if (((prVar1->info).ch | local_68) < 0) {
            uVar6 = 0xffffffff;
          }
          uVar4 = uVar6 + *minlen;
          if ((int)(uVar6 | *minlen) < 0) {
            uVar4 = 0xffffffff;
          }
          *minlen = uVar4;
          uVar6 = (prVar1->info).sub.final;
          uVar4 = uVar6 * local_64;
          if ((int)(uVar6 | local_64) < 0) {
            uVar4 = 0xffffffff;
          }
          uVar6 = uVar4 + *local_48;
          if ((int)(uVar4 | *local_48) < 0) {
            uVar6 = 0xffffffff;
          }
          *local_48 = uVar6;
          maxlen = (int *)local_48;
          goto LAB_002ad23c;
        }
      } while (prVar3->st != init);
      *maxlen = 0xffffffff;
LAB_002ad23c:
      lVar8 = 0x1c;
    }
switchD_002ad0ac_caseD_6:
    init = *(int *)((long)&prVar1->typ + lVar8);
    if (init == final) {
      return;
    }
  } while( true );
}

Assistant:

void CRegexParser::get_match_length(re_state_id init, re_state_id final,
                                    int *minlen, int *maxlen,
                                    regex_scan_frame *stack)
{
    /* set up a stack frame in case we need to recurse */
    regex_scan_frame fr(stack);

    /* start with zero lengths */
    *minlen = *maxlen = 0;

    /* iterate through the machine */
    for (re_state_id i = init ; i != final ; )
    {
        /* remember the current state in our stack frame */
        fr.st = i;

        /* get this tuple */
        re_tuple *t = &tuple_arr_[i];

        /* mark this state as visited, to detect infinite loops */
        t->flags |= RE_STATE_CYCLE_TEST;

        /* check what we have */
        switch (t->typ)
        {
        case RE_TEXT_BEGIN:
        case RE_TEXT_END:
        case RE_LOOKBACK_POS:
        case RE_WORD_BEGIN:
        case RE_WORD_END:
        case RE_WORD_BOUNDARY:
        case RE_NON_WORD_BOUNDARY:
        case RE_GROUP_ENTER:
        case RE_GROUP_EXIT:
        case RE_ASSERT_POS:
        case RE_ASSERT_NEG:
        case RE_ASSERT_BACKPOS:
        case RE_ASSERT_BACKNEG:
        case RE_ZERO_VAR:
            /* 
             *   assertions, group entries, and loop entries contribute
             *   nothing to the match length - continue to the onward branch 
             */
            i = t->next_state_1;
            break;

        case RE_EPSILON:
            /* 
             *   for single-transition epsilons, simply proceed to the next
             *   state 
             */
            if (t->next_state_2 == RE_STATE_INVALID)
            {
                i = t->next_state_1;
                break;
            }

            /*
             *   Epsilon transitions have two lengths: the length of the
             *   first branch, and the length of the second branch.
             *   Calculate the two branches separately, and take the lower of
             *   the minimum values and the higher of the maximum values.
             *   
             *   Before recursing, check to see if we're looping.  If we've
             *   recursed from the current state already in this search,
             *   we're in a loop, so we have a maximum length of infinity.  
             */
            if (fr.is_recursing())
            {
                /* we're looping, so we have an unbounded maximum length */
                *maxlen = -1;
            }
            else
            {
                /* 
                 *   we're not looping yet, so we can recursively calculate
                 *   the length of each sub-branch 
                 */
                int min1, min2, max1, max2;
                get_match_length(t->next_state_1, final, &min1, &max1, &fr);
                get_match_length(t->next_state_2, final, &min2, &max2, &fr);
                
                /* add the lower min and the higher max to the total */
                gml_add(minlen, gml_min(min1, min2));
                gml_add(maxlen, gml_max(max1, max2));
            }

            /* we've fully considered both branches, so we're done */
            return;

        case RE_LOOP_BRANCH:
            /*
             *   A loop branch contributes (min..max) * the length of the
             *   "enter" branch (the first epsilon transition).  Check that
             *   we're not recursing first; if so, we have an unbounded
             *   maximum length.  
             */
            if (fr.is_recursing())
            {
                /* looping - the maximum is unbounded */
                *maxlen = -1;
            }
            else
            {
                /* 
                 *   Calculate the length of the loop branch.  Note that the
                 *   loop ends at the current state. 
                 */
                int loopmin, loopmax;
                get_match_length(t->next_state_1, i, &loopmin, &loopmax, &fr);

                /* add the loop min and max to the running total */
                gml_add(minlen, gml_mul(loopmin, t->info.loop.loop_min));
                gml_add(maxlen, gml_mul(loopmax, t->info.loop.loop_max));
            }

            /* continue from the post-loop state */
            i = t->next_state_2;
            break;

        case RE_GROUP_MATCH:
            /*
             *   A group matcher matches the same length as its corresponding
             *   group.  Find the group entry state, then measure its length
             *   and use it as the result.
             *   
             *   As usual, before recursively calculating the group length,
             *   we need to make sure we're not recursing from the current
             *   state.  
             */
            if (fr.is_recursing())
            {
                /* looping, so the length of this branch is unbounded */
                *maxlen = -1;
            }
            else
            {
                /* locate the enter/exit states for the group */
                re_state_id g, genter, gexit;
                re_tuple *gt;
                for (g = 0, gt = tuple_arr_, genter = gexit = -1 ;
                     g < next_state_ ; ++g, ++gt)
                {
                    if (gt->typ == RE_GROUP_ENTER
                        && gt->info.ch == t->info.ch)
                        genter = g;
                    else if (gt->typ == RE_GROUP_EXIT
                             && gt->info.ch == t->info.ch)
                        gexit = g;
                }

                /* if we found the group, figure its length */
                if (genter >= 0 && gexit >= 0)
                {
                    /* figure the group length range */
                    int gmin, gmax;
                    get_match_length(genter, gexit, &gmin, &gmax, &fr);

                    /* add the group min and max to the running totals */
                    gml_add(minlen, gmin);
                    gml_add(maxlen, gmax);
                }
            }

            /* move on to the next state */
            i = t->next_state_1;
            break;
        
        default:
            /* everything else matches a single character */
            gml_add(minlen, 1);
            gml_add(maxlen, 1);

            /* on to the next state */
            i = t->next_state_1;
            break;
        }
    }
}